

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

StructType * LLVMBC::StructType::get(LLVMContext *context,Vector<Type_*> *member_types)

{
  pointer ppTVar1;
  Type *pTVar2;
  StructType *pSVar3;
  ulong uVar4;
  Type *pTVar5;
  pointer ppTVar6;
  ulong uVar7;
  Vector<Type_*> *__range1;
  StructType *local_38;
  
  ppTVar6 = (context->type_cache).
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (context->type_cache).
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppTVar6 == ppTVar1) {
      pSVar3 = LLVMContext::
               construct<LLVMBC::StructType,LLVMBC::LLVMContext&,std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>>
                         (context,context,member_types);
      local_38 = pSVar3;
      std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
      emplace_back<LLVMBC::Type*>
                ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)
                 &context->type_cache,(Type **)&local_38);
      return pSVar3;
    }
    if ((*ppTVar6)->type_id == StructTyID) {
      pSVar3 = cast<LLVMBC::StructType>(*ppTVar6);
      uVar4 = (ulong)((long)(pSVar3->member_types).
                            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pSVar3->member_types).
                           super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3;
      if ((long)(member_types->
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>)
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(member_types->
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>)
                ._M_impl.super__Vector_impl_data._M_start >> 3 == (uVar4 & 0xffffffff)) {
        uVar7 = 0;
        do {
          if ((uVar4 & 0xffffffff) == uVar7) {
            return pSVar3;
          }
          pTVar2 = (member_types->
                   super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar7];
          pTVar5 = getElementType(pSVar3,(uint)uVar7);
          uVar7 = uVar7 + 1;
        } while (pTVar2 == pTVar5);
      }
    }
    ppTVar6 = ppTVar6 + 1;
  } while( true );
}

Assistant:

StructType *StructType::get(LLVMContext &context, Vector<Type *> member_types)
{
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
	{
		if (type->getTypeID() == TypeID::StructTyID)
		{
			auto *struct_type = cast<StructType>(type);
			if (struct_type->getNumElements() == member_types.size())
			{
				bool equal = true;
				unsigned count = member_types.size();
				for (unsigned i = 0; i < count; i++)
				{
					if (member_types[i] != struct_type->getElementType(i))
					{
						equal = false;
						break;
					}
				}

				if (equal)
					return struct_type;
			}
		}
	}

	auto *type = context.construct<StructType>(context, std::move(member_types));
	cache.push_back(type);
	return type;
}